

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3_lua.c
# Opt level: O3

int l_sqlite3_result_number(lua_State *L)

{
  sqlite3_context *pCtx;
  double rVal;
  
  rVal = (double)luaL_checknumber(L,2);
  pCtx = (sqlite3_context *)checkudata(L,1);
  if ((rVal != (double)(int)rVal) || (NAN(rVal) || NAN((double)(int)rVal))) {
    sqlite3_result_double(pCtx,rVal);
  }
  else {
    sqlite3_result_int(pCtx,(int)rVal);
  }
  return 0;
}

Assistant:

FUNC( l_sqlite3_result_number )
{
  lua_Number number = checknumber(L, 2);
  
  if (IS_INT(number))
    sqlite3_result_int(checkcontext(L, 1), (int)number);
  else
    sqlite3_result_double(checkcontext(L, 1), (double)number);
  
  return 0;
}